

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O0

Value * __thiscall cmFileAPI::BuildReplyIndex(Value *__return_storage_ptr__,cmFileAPI *this)

{
  bool bVar1;
  Value *pVVar2;
  reference ppVar3;
  pair<const_cmFileAPI::Object,_Json::Value> *entry;
  iterator __end1_1;
  iterator __begin1_1;
  map<cmFileAPI::Object,_Json::Value,_std::less<cmFileAPI::Object>,_std::allocator<std::pair<const_cmFileAPI::Object,_Json::Value>_>_>
  *__range1_1;
  Value *local_e8;
  Value *objects;
  ClientQuery *local_b8;
  ClientQuery *clientQuery;
  string *clientName;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileAPI::ClientQuery>
  *client;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileAPI::ClientQuery,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileAPI::ClientQuery>_>_>
  *__range1;
  Value *local_60;
  Value *reply;
  Value local_48;
  undefined1 local_19;
  cmFileAPI *local_18;
  cmFileAPI *this_local;
  Value *index;
  
  local_19 = 0;
  local_18 = this;
  this_local = (cmFileAPI *)__return_storage_ptr__;
  Json::Value::Value(__return_storage_ptr__,objectValue);
  BuildCMake(&local_48,this);
  pVVar2 = Json::Value::operator[](__return_storage_ptr__,"cmake");
  Json::Value::operator=(pVVar2,&local_48);
  Json::Value::~Value(&local_48);
  BuildReply((Value *)&__range1,this,&this->TopQuery);
  pVVar2 = Json::Value::operator[](__return_storage_ptr__,"reply");
  pVVar2 = Json::Value::operator=(pVVar2,(Value *)&__range1);
  Json::Value::~Value((Value *)&__range1);
  local_60 = pVVar2;
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileAPI::ClientQuery,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileAPI::ClientQuery>_>_>
           ::begin(&this->ClientQueries);
  client = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileAPI::ClientQuery>
            *)std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileAPI::ClientQuery,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileAPI::ClientQuery>_>_>
              ::end(&this->ClientQueries);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&client), bVar1) {
    clientQuery = (ClientQuery *)
                  std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileAPI::ClientQuery>_>
                  ::operator*(&__end1);
    local_b8 = &((reference)clientQuery)->second;
    clientName = (string *)clientQuery;
    BuildClientReply((Value *)&objects,this,local_b8);
    pVVar2 = Json::Value::operator[](local_60,(string *)clientQuery);
    Json::Value::operator=(pVVar2,(Value *)&objects);
    Json::Value::~Value((Value *)&objects);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileAPI::ClientQuery>_>
    ::operator++(&__end1);
  }
  Json::Value::Value((Value *)&__range1_1,arrayValue);
  pVVar2 = Json::Value::operator[](__return_storage_ptr__,"objects");
  pVVar2 = Json::Value::operator=(pVVar2,(Value *)&__range1_1);
  Json::Value::~Value((Value *)&__range1_1);
  local_e8 = pVVar2;
  __end1_1 = std::
             map<cmFileAPI::Object,_Json::Value,_std::less<cmFileAPI::Object>,_std::allocator<std::pair<const_cmFileAPI::Object,_Json::Value>_>_>
             ::begin(&this->ReplyIndexObjects);
  entry = (pair<const_cmFileAPI::Object,_Json::Value> *)
          std::
          map<cmFileAPI::Object,_Json::Value,_std::less<cmFileAPI::Object>,_std::allocator<std::pair<const_cmFileAPI::Object,_Json::Value>_>_>
          ::end(&this->ReplyIndexObjects);
  while (bVar1 = std::operator!=(&__end1_1,(_Self *)&entry), bVar1) {
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_cmFileAPI::Object,_Json::Value>_>::operator*
                       (&__end1_1);
    Json::Value::append(local_e8,&ppVar3->second);
    std::_Rb_tree_iterator<std::pair<const_cmFileAPI::Object,_Json::Value>_>::operator++(&__end1_1);
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value cmFileAPI::BuildReplyIndex()
{
  Json::Value index(Json::objectValue);

  // Report information about this version of CMake.
  index["cmake"] = this->BuildCMake();

  // Reply to all queries that we loaded.
  Json::Value& reply = index["reply"] = this->BuildReply(this->TopQuery);
  for (auto const& client : this->ClientQueries) {
    std::string const& clientName = client.first;
    ClientQuery const& clientQuery = client.second;
    reply[clientName] = this->BuildClientReply(clientQuery);
  }

  // Move our index of generated objects into its field.
  Json::Value& objects = index["objects"] = Json::arrayValue;
  for (auto& entry : this->ReplyIndexObjects) {
    objects.append(std::move(entry.second)); // NOLINT(*)
  }

  return index;
}